

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsLotkaVolterra_ASA.c
# Opt level: O3

int quad_rhs(sunrealtype t,N_Vector uvec,N_Vector muvec,N_Vector qBdotvec,void *user_dataB)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  
  if ((sunrealtype *)user_dataB == params) {
    pdVar1 = (double *)N_VGetArrayPointer();
    pdVar2 = (double *)N_VGetArrayPointer(muvec);
    pdVar3 = (double *)N_VGetArrayPointer(qBdotvec);
    *pdVar3 = *pdVar1 * *pdVar2;
    pdVar3[1] = -*pdVar1 * pdVar1[1] * *pdVar2;
    pdVar3[2] = -pdVar1[1] * pdVar2[1];
    pdVar3[3] = *pdVar1 * pdVar1[1] * pdVar2[1];
  }
  return 0;
}

Assistant:

int parameter_vjp(N_Vector vvec, N_Vector Jvvec, sunrealtype t, N_Vector uvec,
                  void* user_data)
{
  if (user_data != params) { return -1; }

  sunrealtype* u  = N_VGetArrayPointer(uvec);
  sunrealtype* v  = N_VGetArrayPointer(vvec);
  sunrealtype* Jv = N_VGetArrayPointer(Jvvec);

  Jv[0] = u[0] * v[0];
  Jv[1] = -u[0] * u[1] * v[0];
  Jv[2] = -u[1] * v[1];
  Jv[3] = u[0] * u[1] * v[1];

  return 0;
}